

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void andres::marray_detail::
     AssignmentOperatorHelper<false,_unsigned_char,_unsigned_char,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
     ::execute(View<unsigned_char,_true,_std::allocator<unsigned_long>_> *from,
              View<unsigned_char,_false,_std::allocator<unsigned_long>_> *to)

{
  uchar uVar1;
  CoordinateOrder CVar2;
  pointer __dest;
  pointer __src;
  undefined8 uVar3;
  bool bVar4;
  size_t sVar5;
  size_t sVar6;
  CoordinateOrder *pCVar7;
  reference puVar8;
  reference puVar9;
  reference puVar10;
  reference puVar11;
  bool local_e1;
  undefined1 local_e0 [8];
  ToIterator itTo;
  FromIterator itFrom;
  undefined1 local_68 [8];
  Marray<unsigned_char,_std::allocator<unsigned_long>_> m;
  size_t j;
  View<unsigned_char,_false,_std::allocator<unsigned_long>_> *to_local;
  View<unsigned_char,_true,_std::allocator<unsigned_long>_> *from_local;
  
  local_e1 = false;
  if (from->data_ != (pointer)0x0) {
    sVar5 = View<unsigned_char,_true,_std::allocator<unsigned_long>_>::dimension(from);
    sVar6 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension(to);
    local_e1 = sVar5 == sVar6;
  }
  Assert<bool>(local_e1);
  for (m._64_8_ = 0; uVar3 = m._64_8_,
      sVar5 = View<unsigned_char,_true,_std::allocator<unsigned_long>_>::dimension(from),
      (ulong)uVar3 < sVar5; m._64_8_ = m._64_8_ + 1) {
    sVar5 = View<unsigned_char,_true,_std::allocator<unsigned_long>_>::shape(from,m._64_8_);
    sVar6 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape(to,m._64_8_);
    Assert<bool>(sVar5 == sVar6);
  }
  bVar4 = View<unsigned_char,true,std::allocator<unsigned_long>>::
          overlaps<unsigned_char,false,std::allocator<unsigned_long>>
                    ((View<unsigned_char,true,std::allocator<unsigned_long>> *)from,to);
  if (bVar4) {
    Marray<unsigned_char,std::allocator<unsigned_long>>::
    Marray<unsigned_char,true,std::allocator<unsigned_long>>
              ((Marray<unsigned_char,std::allocator<unsigned_long>> *)local_68,from);
    execute((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)local_68,to);
    Marray<unsigned_char,_std::allocator<unsigned_long>_>::~Marray
              ((Marray<unsigned_char,_std::allocator<unsigned_long>_> *)local_68);
  }
  else {
    pCVar7 = View<unsigned_char,_true,_std::allocator<unsigned_long>_>::coordinateOrder(from);
    CVar2 = *pCVar7;
    pCVar7 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::coordinateOrder(to);
    if (((CVar2 == *pCVar7) &&
        (bVar4 = View<unsigned_char,_true,_std::allocator<unsigned_long>_>::isSimple(from), bVar4))
       && (bVar4 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::isSimple(to), bVar4))
    {
      __dest = to->data_;
      __src = from->data_;
      sVar5 = View<unsigned_char,_true,_std::allocator<unsigned_long>_>::size(from);
      memcpy(__dest,__src,sVar5);
    }
    else {
      sVar5 = View<unsigned_char,_true,_std::allocator<unsigned_long>_>::dimension(from);
      if (sVar5 == 1) {
        puVar8 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                           ((View<unsigned_char,false,std::allocator<unsigned_long>> *)to,0);
        puVar9 = View<unsigned_char,true,std::allocator<unsigned_long>>::operator()
                           ((View<unsigned_char,true,std::allocator<unsigned_long>> *)from,0);
        OperateHelperBinary<(unsigned_short)1,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
        ::operate(to,from,puVar8,puVar9);
      }
      else {
        sVar5 = View<unsigned_char,_true,_std::allocator<unsigned_long>_>::dimension(from);
        if (sVar5 == 2) {
          puVar8 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                             ((View<unsigned_char,false,std::allocator<unsigned_long>> *)to,0);
          puVar9 = View<unsigned_char,true,std::allocator<unsigned_long>>::operator()
                             ((View<unsigned_char,true,std::allocator<unsigned_long>> *)from,0);
          OperateHelperBinary<(unsigned_short)2,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
          ::operate(to,from,puVar8,puVar9);
        }
        else {
          sVar5 = View<unsigned_char,_true,_std::allocator<unsigned_long>_>::dimension(from);
          if (sVar5 == 3) {
            puVar8 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                               ((View<unsigned_char,false,std::allocator<unsigned_long>> *)to,0);
            puVar9 = View<unsigned_char,true,std::allocator<unsigned_long>>::operator()
                               ((View<unsigned_char,true,std::allocator<unsigned_long>> *)from,0);
            OperateHelperBinary<(unsigned_short)3,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operate(to,from,puVar8,puVar9);
          }
          else {
            sVar5 = View<unsigned_char,_true,_std::allocator<unsigned_long>_>::dimension(from);
            if (sVar5 == 4) {
              puVar8 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                                 ((View<unsigned_char,false,std::allocator<unsigned_long>> *)to,0);
              puVar9 = View<unsigned_char,true,std::allocator<unsigned_long>>::operator()
                                 ((View<unsigned_char,true,std::allocator<unsigned_long>> *)from,0);
              OperateHelperBinary<(unsigned_short)4,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
              ::operate(to,from,puVar8,puVar9);
            }
            else {
              sVar5 = View<unsigned_char,_true,_std::allocator<unsigned_long>_>::dimension(from);
              if (sVar5 == 5) {
                puVar8 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                                   ((View<unsigned_char,false,std::allocator<unsigned_long>> *)to,0)
                ;
                puVar9 = View<unsigned_char,true,std::allocator<unsigned_long>>::operator()
                                   ((View<unsigned_char,true,std::allocator<unsigned_long>> *)from,0
                                   );
                OperateHelperBinary<(unsigned_short)5,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(to,from,puVar8,puVar9);
              }
              else {
                sVar5 = View<unsigned_char,_true,_std::allocator<unsigned_long>_>::dimension(from);
                if (sVar5 == 6) {
                  puVar8 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                                     ((View<unsigned_char,false,std::allocator<unsigned_long>> *)to,
                                      0);
                  puVar9 = View<unsigned_char,true,std::allocator<unsigned_long>>::operator()
                                     ((View<unsigned_char,true,std::allocator<unsigned_long>> *)from
                                      ,0);
                  OperateHelperBinary<(unsigned_short)6,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::operate(to,from,puVar8,puVar9);
                }
                else {
                  sVar5 = View<unsigned_char,_true,_std::allocator<unsigned_long>_>::dimension(from)
                  ;
                  if (sVar5 == 7) {
                    puVar8 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                                       ((View<unsigned_char,false,std::allocator<unsigned_long>> *)
                                        to,0);
                    puVar9 = View<unsigned_char,true,std::allocator<unsigned_long>>::operator()
                                       ((View<unsigned_char,true,std::allocator<unsigned_long>> *)
                                        from,0);
                    OperateHelperBinary<(unsigned_short)7,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                    ::operate(to,from,puVar8,puVar9);
                  }
                  else {
                    sVar5 = View<unsigned_char,_true,_std::allocator<unsigned_long>_>::dimension
                                      (from);
                    if (sVar5 == 8) {
                      puVar8 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                                         ((View<unsigned_char,false,std::allocator<unsigned_long>> *
                                          )to,0);
                      puVar9 = View<unsigned_char,true,std::allocator<unsigned_long>>::operator()
                                         ((View<unsigned_char,true,std::allocator<unsigned_long>> *)
                                          from,0);
                      OperateHelperBinary<(unsigned_short)8,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                      ::operate(to,from,puVar8,puVar9);
                    }
                    else {
                      sVar5 = View<unsigned_char,_true,_std::allocator<unsigned_long>_>::dimension
                                        (from);
                      if (sVar5 == 9) {
                        puVar8 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                                           ((View<unsigned_char,false,std::allocator<unsigned_long>>
                                             *)to,0);
                        puVar9 = View<unsigned_char,true,std::allocator<unsigned_long>>::operator()
                                           ((View<unsigned_char,true,std::allocator<unsigned_long>>
                                             *)from,0);
                        OperateHelperBinary<(unsigned_short)9,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                        ::operate(to,from,puVar8,puVar9);
                      }
                      else {
                        sVar5 = View<unsigned_char,_true,_std::allocator<unsigned_long>_>::dimension
                                          (from);
                        if (sVar5 == 10) {
                          puVar8 = View<unsigned_char,false,std::allocator<unsigned_long>>::
                                   operator()((View<unsigned_char,false,std::allocator<unsigned_long>>
                                               *)to,0);
                          puVar9 = View<unsigned_char,true,std::allocator<unsigned_long>>::
                                   operator()((View<unsigned_char,true,std::allocator<unsigned_long>>
                                               *)from,0);
                          OperateHelperBinary<(unsigned_short)10,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                          ::operate(to,from,puVar8,puVar9);
                        }
                        else {
                          View<unsigned_char,_true,_std::allocator<unsigned_long>_>::begin
                                    ((const_iterator *)
                                     &itTo.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,from);
                          View<unsigned_char,_false,_std::allocator<unsigned_long>_>::begin
                                    ((iterator *)local_e0,to);
                          while (bVar4 = Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>
                                         ::hasMore((
                                                  Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>
                                                  *)&itTo.coordinates_.
                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ), bVar4) {
                            puVar10 = Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>
                                      ::operator*((
                                                  Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>
                                                  *)&itTo.coordinates_.
                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 );
                            uVar1 = *puVar10;
                            puVar11 = Iterator<unsigned_char,_false,_std::allocator<unsigned_long>_>
                                      ::operator*((
                                                  Iterator<unsigned_char,_false,_std::allocator<unsigned_long>_>
                                                  *)local_e0);
                            *puVar11 = uVar1;
                            Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>::
                            operator++((Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>
                                        *)&itTo.coordinates_.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                            Iterator<unsigned_char,_false,_std::allocator<unsigned_long>_>::
                            operator++((Iterator<unsigned_char,_false,_std::allocator<unsigned_long>_>
                                        *)local_e0);
                          }
                          Iterator<unsigned_char,_false,_std::allocator<unsigned_long>_>::~Iterator
                                    ((Iterator<unsigned_char,_false,_std::allocator<unsigned_long>_>
                                      *)local_e0);
                          Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>::~Iterator
                                    ((Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>
                                      *)&itTo.coordinates_.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void execute
    (
        const View<TFrom, true, AFrom>& from,
        View<TTo, false, ATo>& to
    )
    {
        typedef typename View<TFrom, true, AFrom>::const_iterator FromIterator;
        typedef typename View<TTo, false, ATo>::iterator ToIterator;
        if(!MARRAY_NO_ARG_TEST) {
            Assert(from.data_ != 0 && from.dimension() == to.dimension());
            for(std::size_t j=0; j<from.dimension(); ++j) {
                Assert(from.shape(j) == to.shape(j));
            }
        }
        if(from.overlaps(to)) {
            Marray<TFrom, AFrom> m = from; // temporary copy
            execute(m, to);
        }
        else if(from.coordinateOrder() == to.coordinateOrder() 
                && from.isSimple() && to.isSimple()
                && IsEqual<TFrom, TTo>::type) {
            memcpy(to.data_, from.data_, (from.size())*sizeof(TFrom));
        }
        else if(from.dimension() == 1)
            OperateHelperBinary<1, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 2)
            OperateHelperBinary<2, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 3)
            OperateHelperBinary<3, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 4)
            OperateHelperBinary<4, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 5)
            OperateHelperBinary<5, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 6)
            OperateHelperBinary<6, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 7)
            OperateHelperBinary<7, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 8)
            OperateHelperBinary<8, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 9)
            OperateHelperBinary<9, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 10)
            OperateHelperBinary<10, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else {
            FromIterator itFrom = from.begin();
            ToIterator itTo = to.begin();
            for(; itFrom.hasMore(); ++itFrom, ++itTo) {
                *itTo = static_cast<TTo>(*itFrom);
            }
        }
    }